

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.h
# Opt level: O2

string * get_log_file(string *__return_storage_ptr__,string *file_base)

{
  pointer pcVar1;
  __pid_t _Var2;
  ostream *poVar3;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  Logger local_48;
  undefined4 uStack_44;
  
  if (file_base->_M_string_length != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    pcVar1 = (file_base->_M_dataplus)._M_p;
    get_host_name_abi_cxx11_();
    get_user_name_abi_cxx11_();
    print_current_time_abi_cxx11_();
    _Var2 = getpid();
    SStringPrintf(__return_storage_ptr__,"%s.%s.%s.%s.%u",pcVar1,local_68._M_dataplus._M_p,
                  local_88._M_dataplus._M_p,CONCAT44(uStack_44,local_48.severity_),_Var2);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    return __return_storage_ptr__;
  }
  local_48.severity_ = ERR;
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/system.h"
             ,&local_89);
  std::__cxx11::string::string((string *)&local_88,"get_log_file",&local_8a);
  poVar3 = Logger::Start(ERR,&local_68,0x4a,&local_88);
  poVar3 = std::operator<<(poVar3,"CHECK failed ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/base/system.h"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4a);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"!file_base.empty()");
  poVar3 = std::operator<<(poVar3," = ");
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  Logger::~Logger(&local_48);
  abort();
}

Assistant:

std::string get_log_file(const std::string& file_base) {
  CHECK(!file_base.empty());
  std::string filename_prefix;
  SStringPrintf(&filename_prefix,
                "%s.%s.%s.%s.%u",
                file_base.c_str(),
                get_host_name().c_str(),
                get_user_name().c_str(),
                print_current_time().c_str(),
                getpid());
  return filename_prefix;
}